

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Segment::AddCuePoint(Segment *this,uint64_t timestamp,uint64_t track)

{
  Cluster *this_00;
  bool bVar1;
  int32_t iVar2;
  CuePoint *this_01;
  uint64_t uVar3;
  uint64_t in_RDX;
  ulong in_RSI;
  long in_RDI;
  CuePoint *cue;
  Cluster *cluster;
  CuePoint *this_02;
  CuePoint *local_60;
  bool local_1;
  
  if (*(int *)(in_RDI + 0x114) < 1) {
    local_1 = false;
  }
  else {
    this_00 = *(Cluster **)(*(long *)(in_RDI + 0x108) + (long)(*(int *)(in_RDI + 0x114) + -1) * 8);
    if (this_00 == (Cluster *)0x0) {
      local_1 = false;
    }
    else {
      this_01 = (CuePoint *)operator_new(0x28,(nothrow_t *)&std::nothrow);
      local_60 = (CuePoint *)0x0;
      if (this_01 != (CuePoint *)0x0) {
        CuePoint::CuePoint(this_01);
        local_60 = this_01;
      }
      if (local_60 == (CuePoint *)0x0) {
        local_1 = false;
      }
      else {
        uVar3 = SegmentInfo::timecode_scale((SegmentInfo *)(in_RDI + 0x68));
        CuePoint::set_time(local_60,in_RSI / uVar3);
        iVar2 = Cluster::blocks_added(this_00);
        CuePoint::set_block_number(local_60,(long)iVar2);
        this_02 = local_60;
        uVar3 = Cluster::position_for_cues(this_00);
        CuePoint::set_cluster_pos(this_02,uVar3);
        CuePoint::set_track(local_60,in_RDX);
        bVar1 = Cues::AddCue((Cues *)this_01,this_02);
        if (bVar1) {
          *(undefined1 *)(in_RDI + 0x94c) = 0;
          local_1 = true;
        }
        else {
          if (local_60 != (CuePoint *)0x0) {
            CuePoint::~CuePoint(local_60);
            operator_delete(local_60);
          }
          local_1 = false;
        }
      }
    }
  }
  return local_1;
}

Assistant:

bool Segment::AddCuePoint(uint64_t timestamp, uint64_t track) {
  if (cluster_list_size_ < 1)
    return false;

  const Cluster* const cluster = cluster_list_[cluster_list_size_ - 1];
  if (!cluster)
    return false;

  CuePoint* const cue = new (std::nothrow) CuePoint();  // NOLINT
  if (!cue)
    return false;

  cue->set_time(timestamp / segment_info_.timecode_scale());
  cue->set_block_number(cluster->blocks_added());
  cue->set_cluster_pos(cluster->position_for_cues());
  cue->set_track(track);
  if (!cues_.AddCue(cue)) {
    delete cue;
    return false;
  }

  new_cuepoint_ = false;
  return true;
}